

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valueimpl.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
camp::detail::
ConvertVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator()(void)

{
  BadType *__return_storage_ptr__;
  string local_b0;
  string local_90;
  BadType local_70;
  
  __return_storage_ptr__ = (BadType *)__cxa_allocate_exception(0x48);
  BadType::BadType(&local_70,noType,stringType);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/include/camp/detail/valueimpl.hpp"
             ,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "T camp::detail::ConvertVisitor<std::basic_string<char>>::operator()(NoType) const [T = std::basic_string<char>]"
             ,"");
  Error::prepare<camp::BadType>(__return_storage_ptr__,&local_70,&local_b0,0x44,&local_90);
  __cxa_throw(__return_storage_ptr__,&BadType::typeinfo,Error::~Error);
}

Assistant:

T operator()(NoType) const
    {
        // Error: trying to convert an empty value
        CAMP_ERROR(BadType(noType, mapType<T>()));
    }